

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-cave.c
# Opt level: O3

void do_cmd_steal(command *cmd)

{
  player *p;
  _Bool _Var1;
  int in_EAX;
  wchar_t wVar2;
  loc grid;
  square *psVar3;
  monster_conflict *mon;
  wchar_t dir;
  int local_28;
  int local_24;
  
  local_28 = in_EAX;
  wVar2 = cmd_get_direction((command_conflict *)cmd,"direction",&local_28,false);
  if (wVar2 == L'\0') {
    local_24 = local_28;
    grid = (loc)loc_sum(player->grid,(loc_conflict)ddgrid[local_28]);
    p = player;
    player->upkeep->energy_use = (uint)z_info->move_energy;
    _Var1 = player_confuse_dir(p,&local_24,false);
    if (_Var1) {
      grid = (loc)loc_sum(player->grid,(loc_conflict)ddgrid[local_24]);
    }
    psVar3 = square(cave,grid);
    if ((0 < psVar3->mon) &&
       (_Var1 = flag_has_dbg((player->state).pflags,10,0x20,"player->state.pflags","(PF_STEAL)"),
       _Var1)) {
      mon = (monster_conflict *)square_monster(cave,grid);
      steal_monster_item(mon,L'\xffffffff');
      return;
    }
    msg("You spin around.");
  }
  return;
}

Assistant:

void do_cmd_steal(struct command *cmd)
{
	int dir;

	/* Get arguments */
	if (cmd_get_direction(cmd, "direction", &dir, false) != CMD_OK)
		return;

	do_cmd_steal_aux(dir);
}